

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

void Saig_ManDetectConstrFuncTest
               (Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  Vec_Vec_t *local_8;
  
  if (fOldAlgo == 0) {
    local_8 = Ssw_ManFindDirectImplications(p,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    local_8 = Saig_ManDetectConstrFunc(p,nFrames,nConfs,nProps,fVerbose);
  }
  Vec_VecFreeP(&local_8);
  return;
}

Assistant:

void Saig_ManDetectConstrFuncTest( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Vec_Vec_t * vCands;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( p, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( p, nFrames, nConfs, nProps, fVerbose );
    Vec_VecFreeP( &vCands );
}